

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O0

bool bssl::apply_remote_features(SSL *ssl,CBS *in)

{
  unsigned_short uVar1;
  StackIteratorImpl<stack_st_SSL_CIPHER> other;
  bool bVar2;
  int iVar3;
  stack_st_SSL_CIPHER *psVar4;
  size_t sVar5;
  SSL_CIPHER *p;
  pointer psVar6;
  pointer pSVar7;
  pointer psVar8;
  pointer pSVar9;
  type other_00;
  Type *cipher_00;
  unsigned_short *puVar10;
  pointer hs;
  iterator puVar11;
  StackIterator<stack_st_SSL_CIPHER> SVar12;
  StackIteratorImpl<stack_st_SSL_CIPHER> other_01;
  Span<const_unsigned_short> SVar13;
  _Head_base<0UL,_stack_st_SSL_CIPHER_*,_false> local_1c0;
  uint16_t local_1a4;
  byte local_1a1;
  undefined1 local_1a0 [4];
  uint16_t id_1;
  bool supports_alps;
  CBS alps;
  uint16_t supported_group;
  unsigned_short *__end2;
  unsigned_short *__begin2;
  Array<unsigned_short> *__range2;
  bool ok;
  uint16_t configured_group;
  iterator __end1_2;
  iterator __begin1_2;
  Span<const_unsigned_short> *__range1_2;
  Array<unsigned_short> new_configured_groups;
  Span<const_unsigned_short> configured_groups;
  size_t sStack_128;
  uint16_t group;
  size_t idx;
  Array<unsigned_short> supported_groups;
  CBS groups;
  SSL_CIPHER *unsupported_cipher;
  StackIterator<stack_st_SSL_CIPHER> __end1_1;
  StackIterator<stack_st_SSL_CIPHER> __begin1_1;
  pointer *__range1_1;
  SSL_CIPHER *local_b0;
  SSL_CIPHER *configured_cipher;
  stack_st_SSL_CIPHER *psStack_a0;
  SSL_CIPHER *pSStack_90;
  StackIterator<stack_st_SSL_CIPHER> __end1;
  StackIterator<stack_st_SSL_CIPHER> __begin1;
  stack_st_SSL_CIPHER **__range1;
  UniquePtr<struct_stack_st_SSL_CIPHER> unsupported;
  stack_st_SSL_CIPHER *configured;
  SSL_CIPHER *cipher;
  uint16_t local_3e [3];
  uint16_t id;
  UniquePtr<struct_stack_st_SSL_CIPHER> supported;
  CBS ciphers;
  CBS *in_local;
  SSL *ssl_local;
  
  iVar3 = CBS_get_asn1(in,(CBS *)&supported,4);
  if (iVar3 == 0) {
    return false;
  }
  psVar4 = sk_SSL_CIPHER_new_null();
  std::unique_ptr<stack_st_SSL_CIPHER,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<stack_st_SSL_CIPHER,bssl::internal::Deleter> *)&stack0xffffffffffffffc8,
             psVar4);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xffffffffffffffc8);
  if (bVar2) {
    do {
      do {
        sVar5 = CBS_len((CBS *)&supported);
        if (sVar5 == 0) {
          pSVar7 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->
                             (&ssl->config);
          bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pSVar7->cipher_list);
          if (bVar2) {
            pSVar7 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->
                               (&ssl->config);
            pSVar9 = std::unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>::
                     operator->(&pSVar7->cipher_list);
            local_1c0._M_head_impl =
                 std::unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter>::get
                           (&pSVar9->ciphers);
          }
          else {
            psVar8 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl->ctx);
            pSVar9 = std::unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>::
                     operator->(&psVar8->cipher_list);
            local_1c0._M_head_impl =
                 std::unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter>::get
                           (&pSVar9->ciphers);
          }
          unsupported._M_t.super___uniq_ptr_impl<stack_st_SSL_CIPHER,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>._M_head_impl =
               (__uniq_ptr_data<stack_st_SSL_CIPHER,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_data<stack_st_SSL_CIPHER,_bssl::internal::Deleter,_true,_true>)
               local_1c0._M_head_impl;
          psVar4 = sk_SSL_CIPHER_new_null();
          std::unique_ptr<stack_st_SSL_CIPHER,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<stack_st_SSL_CIPHER,bssl::internal::Deleter> *)&__range1,psVar4);
          bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&__range1);
          if (bVar2) {
            SVar12 = begin<stack_st_SSL_CIPHER>
                               ((stack_st_SSL_CIPHER *)
                                unsupported._M_t.
                                super___uniq_ptr_impl<stack_st_SSL_CIPHER,_bssl::internal::Deleter>.
                                _M_t.
                                super__Tuple_impl<0UL,_stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>
                                .super__Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>._M_head_impl);
            __end1.idx_ = (size_t)SVar12.sk_;
            other_01 = end<stack_st_SSL_CIPHER>
                                 ((stack_st_SSL_CIPHER *)
                                  unsupported._M_t.
                                  super___uniq_ptr_impl<stack_st_SSL_CIPHER,_bssl::internal::Deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>._M_head_impl)
            ;
            goto LAB_00177c93;
          }
          ssl_local._7_1_ = false;
          local_3e[1] = 1;
          local_3e[2] = 0;
          goto LAB_0017856d;
        }
        iVar3 = CBS_get_u16((CBS *)&supported,local_3e);
        if (iVar3 == 0) {
          ssl_local._7_1_ = false;
          local_3e[1] = 1;
          local_3e[2] = 0;
          goto LAB_00178583;
        }
        p = SSL_get_cipher_by_value(local_3e[0]);
      } while (p == (SSL_CIPHER *)0x0);
      psVar6 = std::unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter>::get
                         ((unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter> *)
                          &stack0xffffffffffffffc8);
      sVar5 = sk_SSL_CIPHER_push(psVar6,p);
    } while (sVar5 != 0);
    ssl_local._7_1_ = false;
    local_3e[1] = 1;
    local_3e[2] = 0;
  }
  else {
    ssl_local._7_1_ = false;
    local_3e[1] = 1;
    local_3e[2] = 0;
  }
  goto LAB_00178583;
LAB_00177c93:
  __end1.sk_ = (stack_st_SSL_CIPHER *)other_01.idx_;
  pSStack_90 = (SSL_CIPHER *)other_01.sk_;
  configured_cipher = pSStack_90;
  psStack_a0 = __end1.sk_;
  bVar2 = internal::StackIteratorImpl<stack_st_SSL_CIPHER>::operator!=
                    ((StackIteratorImpl<stack_st_SSL_CIPHER> *)&__end1.idx_,other_01);
  if (!bVar2) goto LAB_00177d81;
  local_b0 = internal::StackIteratorImpl<stack_st_SSL_CIPHER>::operator*
                       ((StackIteratorImpl<stack_st_SSL_CIPHER> *)&__end1.idx_);
  psVar6 = std::unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter>::get
                     ((unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter> *)
                      &stack0xffffffffffffffc8);
  iVar3 = sk_SSL_CIPHER_find(psVar6,(size_t *)0x0,local_b0);
  if (iVar3 == 0) {
    psVar6 = std::unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter>::get
                       ((unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter> *)&__range1);
    sVar5 = sk_SSL_CIPHER_push(psVar6,local_b0);
    if (sVar5 == 0) {
      ssl_local._7_1_ = false;
      local_3e[1] = 1;
      local_3e[2] = 0;
      goto LAB_0017856d;
    }
  }
  internal::StackIteratorImpl<stack_st_SSL_CIPHER>::operator++
            ((StackIteratorImpl<stack_st_SSL_CIPHER> *)&__end1.idx_);
  other_01.idx_ = (size_t)__end1.sk_;
  other_01.sk_ = (stack_st_SSL_CIPHER *)pSStack_90;
  goto LAB_00177c93;
LAB_00177d81:
  psVar6 = std::unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter>::get
                     ((unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter> *)&__range1);
  sVar5 = sk_SSL_CIPHER_num(psVar6);
  if (sVar5 == 0) {
LAB_00177ea1:
    psVar6 = std::unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter>::get
                       ((unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter> *)&__range1);
    SVar12 = begin<stack_st_SSL_CIPHER>(psVar6);
    __end1_1.idx_ = (size_t)SVar12.sk_;
    SVar12 = end<stack_st_SSL_CIPHER>(psVar6);
    __end1_1.sk_ = (stack_st_SSL_CIPHER *)SVar12.idx_;
    while (other.idx_ = (size_t)__end1_1.sk_, other.sk_ = SVar12.sk_,
          bVar2 = internal::StackIteratorImpl<stack_st_SSL_CIPHER>::operator!=
                            ((StackIteratorImpl<stack_st_SSL_CIPHER> *)&__end1_1.idx_,other), bVar2)
    {
      cipher_00 = internal::StackIteratorImpl<stack_st_SSL_CIPHER>::operator*
                            ((StackIteratorImpl<stack_st_SSL_CIPHER> *)&__end1_1.idx_);
      pSVar7 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
      pSVar9 = std::unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>::operator->
                         (&pSVar7->cipher_list);
      SSLCipherPreferenceList::Remove(pSVar9,cipher_00);
      internal::StackIteratorImpl<stack_st_SSL_CIPHER>::operator++
                ((StackIteratorImpl<stack_st_SSL_CIPHER> *)&__end1_1.idx_);
    }
    psVar4 = (stack_st_SSL_CIPHER *)SSL_get_ciphers((SSL *)ssl);
    sVar5 = sk_SSL_CIPHER_num(psVar4);
    if (sVar5 == 0) {
      ssl_local._7_1_ = false;
      local_3e[1] = 1;
      local_3e[2] = 0;
    }
    else {
      iVar3 = CBS_get_asn1(in,(CBS *)&supported_groups.size_,4);
      if (iVar3 == 0) {
        ssl_local._7_1_ = false;
        local_3e[1] = 1;
        local_3e[2] = 0;
      }
      else {
        Array<unsigned_short>::Array((Array<unsigned_short> *)&idx);
        sVar5 = CBS_len((CBS *)&supported_groups.size_);
        bVar2 = Array<unsigned_short>::InitForOverwrite((Array<unsigned_short> *)&idx,sVar5 >> 1);
        if (bVar2) {
          sStack_128 = 0;
          while (sVar5 = CBS_len((CBS *)&supported_groups.size_), sVar5 != 0) {
            iVar3 = CBS_get_u16((CBS *)&supported_groups.size_,
                                (uint16_t *)((long)&configured_groups.size_ + 6));
            uVar1 = configured_groups.size_._6_2_;
            if (iVar3 == 0) {
              ssl_local._7_1_ = false;
              local_3e[1] = 1;
              local_3e[2] = 0;
              goto LAB_00178551;
            }
            puVar10 = Array<unsigned_short>::operator[]((Array<unsigned_short> *)&idx,sStack_128);
            *puVar10 = uVar1;
            sStack_128 = sStack_128 + 1;
          }
          hs = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::get(&ssl->s3->hs);
          SVar13 = tls1_get_grouplist(hs);
          configured_groups.data_ = (unsigned_short *)SVar13.size_;
          new_configured_groups.size_ = (size_t)SVar13.data_;
          Array<unsigned_short>::Array((Array<unsigned_short> *)&__range1_2);
          sVar5 = Span<const_unsigned_short>::size
                            ((Span<const_unsigned_short> *)&new_configured_groups.size_);
          bVar2 = Array<unsigned_short>::InitForOverwrite
                            ((Array<unsigned_short> *)&__range1_2,sVar5);
          if (bVar2) {
            sStack_128 = 0;
            __end1_2 = Span<const_unsigned_short>::begin
                                 ((Span<const_unsigned_short> *)&new_configured_groups.size_);
            puVar11 = Span<const_unsigned_short>::end
                                ((Span<const_unsigned_short> *)&new_configured_groups.size_);
            for (; __end1_2 != puVar11; __end1_2 = __end1_2 + 1) {
              uVar1 = *__end1_2;
              bVar2 = false;
              __end2 = Array<unsigned_short>::begin((Array<unsigned_short> *)&idx);
              puVar10 = Array<unsigned_short>::end((Array<unsigned_short> *)&idx);
              for (; __end2 != puVar10; __end2 = __end2 + 1) {
                alps.len._6_2_ = *__end2;
                if (alps.len._6_2_ == uVar1) {
                  bVar2 = true;
                  break;
                }
              }
              if (bVar2) {
                puVar10 = Array<unsigned_short>::operator[]
                                    ((Array<unsigned_short> *)&__range1_2,sStack_128);
                *puVar10 = uVar1;
                sStack_128 = sStack_128 + 1;
              }
            }
            if (sStack_128 == 0) {
              ssl_local._7_1_ = false;
            }
            else {
              Array<unsigned_short>::Shrink((Array<unsigned_short> *)&__range1_2,sStack_128);
              pSVar7 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->
                                 (&ssl->config);
              Array<unsigned_short>::operator=
                        (&pSVar7->supported_group_list,(Array<unsigned_short> *)&__range1_2);
              CBS_init((CBS *)local_1a0,(uint8_t *)0x0,0);
              iVar3 = CBS_get_optional_asn1(in,(CBS *)local_1a0,(int *)0x0,0x80000000);
              if (iVar3 == 0) {
                ssl_local._7_1_ = false;
              }
              else {
                local_1a1 = 0;
                do {
                  sVar5 = CBS_len((CBS *)local_1a0);
                  if (sVar5 == 0) goto LAB_00178511;
                  iVar3 = CBS_get_u16((CBS *)local_1a0,&local_1a4);
                  if (iVar3 == 0) {
                    ssl_local._7_1_ = false;
                    goto LAB_00178545;
                  }
                } while (((local_1a4 != 0x44cd) ||
                         (pSVar7 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::
                                   operator->(&ssl->config),
                         (*(ushort *)&pSVar7->field_0x10d >> 0xd & 1) == 0)) &&
                        ((local_1a4 != 0x4469 ||
                         (pSVar7 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::
                                   operator->(&ssl->config),
                         (*(ushort *)&pSVar7->field_0x10d >> 0xd & 1) != 0))));
                local_1a1 = 1;
LAB_00178511:
                if ((local_1a1 & 1) == 0) {
                  pSVar7 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->
                                     (&ssl->config);
                  Vector<bssl::ALPSConfig>::clear(&pSVar7->alps_configs);
                }
                ssl_local._7_1_ = true;
              }
            }
          }
          else {
            ssl_local._7_1_ = false;
          }
LAB_00178545:
          local_3e[1] = 1;
          local_3e[2] = 0;
          Array<unsigned_short>::~Array((Array<unsigned_short> *)&__range1_2);
        }
        else {
          ssl_local._7_1_ = false;
          local_3e[1] = 1;
          local_3e[2] = 0;
        }
LAB_00178551:
        Array<unsigned_short>::~Array((Array<unsigned_short> *)&idx);
      }
    }
  }
  else {
    pSVar7 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pSVar7->cipher_list);
    if (bVar2) goto LAB_00177ea1;
    MakeUnique<bssl::SSLCipherPreferenceList>();
    pSVar7 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
    std::unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>::operator=
              (&pSVar7->cipher_list,
               (unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter> *)&__range1_1);
    std::unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter> *)&__range1_1);
    pSVar7 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pSVar7->cipher_list);
    if (bVar2) {
      pSVar7 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
      pSVar9 = std::unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>::operator->
                         (&pSVar7->cipher_list);
      psVar8 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl->ctx);
      other_00 = std::unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>::operator*
                           (&psVar8->cipher_list);
      bVar2 = SSLCipherPreferenceList::Init(pSVar9,other_00);
      if (bVar2) goto LAB_00177ea1;
    }
    ssl_local._7_1_ = false;
    local_3e[1] = 1;
    local_3e[2] = 0;
  }
LAB_0017856d:
  std::unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter> *)&__range1);
LAB_00178583:
  std::unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter> *)&stack0xffffffffffffffc8);
  return ssl_local._7_1_;
}

Assistant:

static bool apply_remote_features(SSL *ssl, CBS *in) {
  CBS ciphers;
  if (!CBS_get_asn1(in, &ciphers, CBS_ASN1_OCTETSTRING)) {
    return false;
  }
  bssl::UniquePtr<STACK_OF(SSL_CIPHER)> supported(sk_SSL_CIPHER_new_null());
  if (!supported) {
    return false;
  }
  while (CBS_len(&ciphers)) {
    uint16_t id;
    if (!CBS_get_u16(&ciphers, &id)) {
      return false;
    }
    const SSL_CIPHER *cipher = SSL_get_cipher_by_value(id);
    if (!cipher) {
      continue;
    }
    if (!sk_SSL_CIPHER_push(supported.get(), cipher)) {
      return false;
    }
  }
  STACK_OF(SSL_CIPHER) *configured =
      ssl->config->cipher_list ? ssl->config->cipher_list->ciphers.get()
                               : ssl->ctx->cipher_list->ciphers.get();
  bssl::UniquePtr<STACK_OF(SSL_CIPHER)> unsupported(sk_SSL_CIPHER_new_null());
  if (!unsupported) {
    return false;
  }
  for (const SSL_CIPHER *configured_cipher : configured) {
    if (sk_SSL_CIPHER_find(supported.get(), nullptr, configured_cipher)) {
      continue;
    }
    if (!sk_SSL_CIPHER_push(unsupported.get(), configured_cipher)) {
      return false;
    }
  }
  if (sk_SSL_CIPHER_num(unsupported.get()) && !ssl->config->cipher_list) {
    ssl->config->cipher_list = bssl::MakeUnique<SSLCipherPreferenceList>();
    if (!ssl->config->cipher_list ||
        !ssl->config->cipher_list->Init(*ssl->ctx->cipher_list)) {
      return false;
    }
  }
  for (const SSL_CIPHER *unsupported_cipher : unsupported.get()) {
    ssl->config->cipher_list->Remove(unsupported_cipher);
  }
  if (sk_SSL_CIPHER_num(SSL_get_ciphers(ssl)) == 0) {
    return false;
  }

  CBS groups;
  if (!CBS_get_asn1(in, &groups, CBS_ASN1_OCTETSTRING)) {
    return false;
  }
  Array<uint16_t> supported_groups;
  if (!supported_groups.InitForOverwrite(CBS_len(&groups) / 2)) {
    return false;
  }
  size_t idx = 0;
  while (CBS_len(&groups)) {
    uint16_t group;
    if (!CBS_get_u16(&groups, &group)) {
      return false;
    }
    supported_groups[idx++] = group;
  }
  Span<const uint16_t> configured_groups =
      tls1_get_grouplist(ssl->s3->hs.get());
  Array<uint16_t> new_configured_groups;
  if (!new_configured_groups.InitForOverwrite(configured_groups.size())) {
    return false;
  }
  idx = 0;
  for (uint16_t configured_group : configured_groups) {
    bool ok = false;
    for (uint16_t supported_group : supported_groups) {
      if (supported_group == configured_group) {
        ok = true;
        break;
      }
    }
    if (ok) {
      new_configured_groups[idx++] = configured_group;
    }
  }
  if (idx == 0) {
    return false;
  }
  new_configured_groups.Shrink(idx);
  ssl->config->supported_group_list = std::move(new_configured_groups);

  CBS alps;
  CBS_init(&alps, nullptr, 0);
  if (!CBS_get_optional_asn1(in, &alps, /*out_present=*/nullptr,
                             kHandoffTagALPS)) {
    return false;
  }
  bool supports_alps = false;
  while (CBS_len(&alps) != 0) {
    uint16_t id;
    if (!CBS_get_u16(&alps, &id)) {
      return false;
    }
    // For now, we support two ALPS codepoints, so we need to extract both
    // codepoints, and then filter what the handshaker might try to send.
    if ((id == TLSEXT_TYPE_application_settings &&
         ssl->config->alps_use_new_codepoint) ||
        (id == TLSEXT_TYPE_application_settings_old &&
         !ssl->config->alps_use_new_codepoint)) {
      supports_alps = true;
      break;
    }
  }
  if (!supports_alps) {
    ssl->config->alps_configs.clear();
  }

  return true;
}